

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int rd_contents(archive_read *a,void **buff,size_t *size,size_t *used,uint64_t remaining)

{
  void *pvVar1;
  uint uVar2;
  void *pvVar3;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var4;
  char *pcVar5;
  int error_number;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ssize_t bytes;
  ulong local_48;
  long local_40;
  void *local_38;
  
  local_38 = __archive_read_ahead(a,1,(ssize_t *)&local_48);
  uVar7 = local_48;
  if ((long)local_48 < 0) goto LAB_0013c5aa;
  if (local_48 == 0) {
    pcVar5 = "Truncated archive file";
    error_number = -1;
LAB_0013c59d:
    archive_set_error(&a->archive,error_number,pcVar5);
LAB_0013c5a4:
    uVar7 = 0xffffffe2;
    goto LAB_0013c5aa;
  }
  if (remaining < local_48) {
    local_48 = remaining;
  }
  uVar9 = local_48;
  *used = local_48;
  pvVar1 = a->format->data;
  pvVar3 = *buff;
  if (pvVar3 == (void *)0x0) {
    if (*(long *)((long)pvVar1 + 0x20) == 0) {
      pvVar3 = malloc(0x10000);
      *(void **)((long)pvVar1 + 0x20) = pvVar3;
      if (pvVar3 == (void *)0x0) {
        pcVar5 = "Couldn\'t allocate memory for out buffer";
        error_number = 0xc;
        goto LAB_0013c59d;
      }
    }
    pvVar3 = *(void **)((long)pvVar1 + 0x20);
    *buff = pvVar3;
    sVar8 = 0x10000;
  }
  else {
    sVar8 = *size;
  }
  if (*(int *)((long)pvVar1 + 0x60) - 3U < 2) {
    local_40 = (long)pvVar1 + 0xe0;
    *(void **)((long)pvVar1 + 0xe0) = local_38;
    *(ulong *)((long)pvVar1 + 0xe8) = uVar9;
    *(void **)((long)pvVar1 + 0xf8) = pvVar3;
    *(size_t *)((long)pvVar1 + 0x100) = sVar8;
    uVar2 = lzma_code(local_40,0);
    if (uVar2 != 0) {
      if (uVar2 != 1) {
        pcVar5 = "application/x-lzma";
        if (*(int *)((long)pvVar1 + 0x1f8) == 4) {
          pcVar5 = "application/x-xz";
        }
        archive_set_error(&a->archive,-1,"%s decompression failed(%d)",pcVar5 + 0xe,(ulong)uVar2);
        goto LAB_0013c5a4;
      }
      lzma_end(local_40);
      *(undefined4 *)((long)pvVar1 + 0x168) = 0;
    }
    *used = uVar9 - *(long *)((long)pvVar1 + 0xe8);
    uVar9 = *(ulong *)((long)pvVar1 + 0x100);
LAB_0013c6a6:
    uVar9 = sVar8 - uVar9;
  }
  else {
    if (*(int *)((long)pvVar1 + 0x60) == 1) {
      *(void **)((long)pvVar1 + 0x68) = local_38;
      *(int *)((long)pvVar1 + 0x70) = (int)uVar9;
      *(void **)((long)pvVar1 + 0x80) = pvVar3;
      *(int *)((long)pvVar1 + 0x88) = (int)sVar8;
      uVar2 = inflate((long)pvVar1 + 0x68,0);
      if (1 < uVar2) {
        archive_set_error(&a->archive,-1,"File decompression failed (%d)",(ulong)uVar2);
        goto LAB_0013c5a4;
      }
      *used = uVar9 - *(uint *)((long)pvVar1 + 0x70);
      uVar9 = (ulong)*(uint *)((long)pvVar1 + 0x88);
      goto LAB_0013c6a6;
    }
    if (pvVar3 == *(void **)((long)pvVar1 + 0x20)) {
      *buff = local_38;
    }
    else {
      if (sVar8 < uVar9) {
        uVar9 = sVar8;
      }
      memcpy(pvVar3,local_38,uVar9);
      *used = uVar9;
    }
  }
  *size = uVar9;
  pvVar1 = *buff;
  pvVar3 = a->format->data;
  if (*(int *)((long)pvVar3 + 0x170) == 1) {
    pp_Var4 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lVar6 = 0x180;
LAB_0013c763:
    (**pp_Var4)((archive_md5_ctx *)(lVar6 + (long)pvVar3),local_38,*used);
  }
  else if (*(int *)((long)pvVar3 + 0x170) == 2) {
    pp_Var4 = &__archive_digest.md5update;
    lVar6 = 0x178;
    goto LAB_0013c763;
  }
  uVar7 = 0;
  if (*(int *)((long)pvVar3 + 0x188) == 2) {
    __archive_md5update((archive_md5_ctx *)((long)pvVar3 + 400),pvVar1,uVar9);
  }
  else if (*(int *)((long)pvVar3 + 0x188) == 1) {
    __archive_sha1update((archive_sha1_ctx *)((long)pvVar3 + 0x198),pvVar1,uVar9);
  }
LAB_0013c5aa:
  return (int)uVar7;
}

Assistant:

static int
rd_contents(struct archive_read *a, const void **buff, size_t *size,
    size_t *used, uint64_t remaining)
{
	const unsigned char *b;
	ssize_t bytes;

	/* Get whatever bytes are immediately available. */
	b = __archive_read_ahead(a, 1, &bytes);
	if (bytes < 0)
		return ((int)bytes);
	if (bytes == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated archive file");
		return (ARCHIVE_FATAL);
	}
	if ((uint64_t)bytes > remaining)
		bytes = (ssize_t)remaining;

	/*
	 * Decompress contents of file.
	 */
	*used = bytes;
	if (decompress(a, buff, size, b, used) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/*
	 * Update checksum of a compressed data and a extracted data.
	 */
	checksum_update(a, b, *used, *buff, *size);

	return (ARCHIVE_OK);
}